

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variable_table.cpp
# Opt level: O2

void __thiscall
Variable_table::designate_variables_recursive(Variable_table *this,Node *current_node)

{
  Variable *this_00;
  Variable *var;
  string name;
  
  if (current_node != (Node *)0x0) {
    if (current_node->type == DCLRT) {
      std::__cxx11::string::string((string *)&name,(string *)current_node->operand1->operand1);
      this_00 = (Variable *)operator_new(0x28);
      Variable::Variable(this_00,&name,INTEGER);
      var = this_00;
      std::vector<Variable_*,_std::allocator<Variable_*>_>::push_back(&this->vars,&var);
      std::__cxx11::string::~string((string *)&name);
    }
    designate_variables_recursive(this,current_node->operand1);
    designate_variables_recursive(this,current_node->operand2);
    designate_variables_recursive(this,current_node->operand3);
    designate_variables_recursive(this,current_node->operand4);
  }
  return;
}

Assistant:

void Variable_table::designate_variables_recursive(Node* current_node)
{
	if (current_node == nullptr) {
		return;
	}

	if (current_node->type == node_type::DCLRT) { 
		string name = current_node->operand1->operand1->value;
		Variable* var = new Variable(name, INTEGER);

		vars.push_back(var);
	}

	designate_variables_recursive(current_node->operand1);
	designate_variables_recursive(current_node->operand2);
	designate_variables_recursive(current_node->operand3);
	designate_variables_recursive(current_node->operand4);
}